

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gateway.cc
# Opt level: O1

void __thiscall
prometheus::Gateway::Gateway
          (Gateway *this,string *host,string *port,string *jobname,Labels *labels,string *username,
          string *password,seconds timeout)

{
  pointer pcVar1;
  long *plVar2;
  long *plVar3;
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  undefined1 *local_b0;
  undefined8 local_a8;
  undefined1 local_a0;
  undefined7 uStack_9f;
  undefined8 uStack_98;
  rep local_90;
  Gateway *local_88;
  string *local_80;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  local_a8 = 0;
  local_a0 = 0;
  local_90 = timeout.__r;
  local_b0 = &local_a0;
  if (username->_M_string_length != 0) {
    local_d0[0] = local_c0;
    pcVar1 = (username->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)local_d0,pcVar1,pcVar1 + username->_M_string_length);
    ::std::__cxx11::string::append((char *)local_d0);
    local_88 = this;
    local_80 = host;
    plVar2 = (long *)::std::__cxx11::string::_M_append
                               ((char *)local_d0,(ulong)(password->_M_dataplus)._M_p);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_40 = *plVar3;
      lStack_38 = plVar2[3];
      local_50 = &local_40;
    }
    else {
      local_40 = *plVar3;
      local_50 = (long *)*plVar2;
    }
    local_48 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    ::std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_50);
    if (local_50 != &local_40) {
      operator_delete(local_50);
    }
    host = local_80;
    this = local_88;
    if (local_d0[0] != local_c0) {
      operator_delete(local_d0[0]);
      host = local_80;
      this = local_88;
    }
  }
  local_68 = (code *)0x0;
  pcStack_60 = (code *)0x0;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_78._M_unused._M_object = operator_new(0x28);
  *(code **)local_78._M_unused._0_8_ = (code *)((long)local_78._M_unused._0_8_ + 0x10);
  if (local_b0 == &local_a0) {
    *(ulong *)((long)local_78._M_unused._0_8_ + 0x10) = CONCAT71(uStack_9f,local_a0);
    *(undefined8 *)((long)local_78._M_unused._0_8_ + 0x18) = uStack_98;
  }
  else {
    *(undefined1 **)local_78._M_unused._0_8_ = local_b0;
    *(ulong *)((long)local_78._M_unused._0_8_ + 0x10) = CONCAT71(uStack_9f,local_a0);
  }
  *(undefined8 *)((long)local_78._M_unused._0_8_ + 8) = local_a8;
  local_a8 = 0;
  local_a0 = 0;
  *(rep *)((long)local_78._M_unused._0_8_ + 0x20) = local_90;
  pcStack_60 = ::std::
               _Function_handler<void_(void_*),_prometheus::(anonymous_namespace)::SetupAdapter>::
               _M_invoke;
  local_68 = ::std::
             _Function_handler<void_(void_*),_prometheus::(anonymous_namespace)::SetupAdapter>::
             _M_manager;
  local_b0 = &local_a0;
  Gateway(this,host,port,(function<void_(void_*)> *)&local_78,jobname,labels);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  return;
}

Assistant:

Gateway::Gateway(const std::string& host, const std::string& port,
                 const std::string& jobname, const Labels& labels,
                 const std::string& username, const std::string& password,
                 std::chrono::seconds timeout)
    : Gateway(host, port, SetupAdapter{username, password, timeout}, jobname,
              labels) {}